

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsTTDPreExecuteSnapShotInterval
          (JsRuntimeHandle runtimeHandle,int64_t startSnapTime,int64_t endSnapTime,
          JsTTDMoveMode moveMode,int64_t *newTargetEventTime)

{
  anon_class_16_2_9bfaabe8 fn;
  anon_class_16_2_9bfaabe8 fn_00;
  bool bVar1;
  ThreadContext *pTVar2;
  bool bpFound;
  TTDebuggerAbortException abortException;
  JsErrorCode inflateStatus;
  JsErrorCode res;
  ExecutionInfoManager *emanager;
  EventLog *elog;
  ThreadContext *threadContext;
  JsrtRuntime *runtime;
  int64_t *newTargetEventTime_local;
  int64_t iStack_28;
  JsTTDMoveMode moveMode_local;
  int64_t endSnapTime_local;
  int64_t startSnapTime_local;
  JsRuntimeHandle runtimeHandle_local;
  
  *newTargetEventTime = -1;
  runtime = (JsrtRuntime *)newTargetEventTime;
  newTargetEventTime_local._4_4_ = moveMode;
  iStack_28 = endSnapTime;
  endSnapTime_local = startSnapTime;
  startSnapTime_local = (int64_t)runtimeHandle;
  threadContext = (ThreadContext *)JsrtRuntime::FromHandle(runtimeHandle);
  elog = (EventLog *)JsrtRuntime::GetThreadContext((JsrtRuntime *)threadContext);
  bVar1 = ThreadContext::IsRuntimeInTTDMode((ThreadContext *)elog);
  if (bVar1) {
    emanager = (ExecutionInfoManager *)elog[7].m_propertyRecordList.m_alloc;
    _inflateStatus = (ExecutionInfoManager *)elog[7].m_propertyRecordList.m_inlineHeadBlock.Next;
    runtimeHandle_local._4_4_ =
         TTDHandleBreakpointInfoAndInflate
                   (endSnapTime_local,(JsrtRuntime *)threadContext,(ThreadContext *)elog);
    if (runtimeHandle_local._4_4_ == JsNoError) {
      if ((newTargetEventTime_local._4_4_ &
          JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) ==
          JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) {
        fn_00.threadContext = (ThreadContext **)&elog;
        fn_00.emanager = (ExecutionInfoManager **)&inflateStatus;
        GlobalAPIWrapper_NoRecord<JsTTDPreExecuteSnapShotInterval::__0>(fn_00);
      }
      TTD::EventLog::PushMode((EventLog *)emanager,DebuggerSuppressBreakpoints);
      TTD::EventLog::PushMode((EventLog *)emanager,DebuggerLogBreakpoints);
      if (iStack_28 == -1) {
        TTD::EventLog::ReplayRootEventsToTime((EventLog *)emanager,0x7fffffffffffffff);
      }
      else {
        TTD::EventLog::ReplayRootEventsToTime((EventLog *)emanager,iStack_28);
      }
      TTD::EventLog::PopMode((EventLog *)emanager,DebuggerLogBreakpoints);
      TTD::EventLog::PopMode((EventLog *)emanager,DebuggerSuppressBreakpoints);
      if ((newTargetEventTime_local._4_4_ &
          JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) ==
          JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) {
        fn.threadContext = (ThreadContext **)&elog;
        fn.emanager = (ExecutionInfoManager **)&inflateStatus;
        GlobalAPIWrapper_NoRecord<JsTTDPreExecuteSnapShotInterval::__1>(fn);
      }
      if (((newTargetEventTime_local._4_4_ & JsTTDMoveScanIntervalForContinue) ==
           JsTTDMoveScanIntervalForContinue) &&
         (bVar1 = TTD::ExecutionInfoManager::TryFindAndSetPreviousBP(_inflateStatus), bVar1)) {
        pTVar2 = (ThreadContext *)
                 TTD::ExecutionInfoManager::GetPendingTTDBPTargetEventTime(_inflateStatus);
        runtime->threadContext = pTVar2;
      }
      runtimeHandle_local._4_4_ = JsNoError;
    }
    return runtimeHandle_local._4_4_;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDPreExecuteSnapShotInterval(_In_ JsRuntimeHandle runtimeHandle, _In_ int64_t startSnapTime, _In_ int64_t endSnapTime, _In_ JsTTDMoveMode moveMode, _Out_ int64_t* newTargetEventTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else

    *newTargetEventTime = -1;

    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    TTD::EventLog* elog = threadContext->TTDLog;
    TTD::ExecutionInfoManager* emanager = threadContext->TTDExecutionInfo;
    JsErrorCode res = JsNoError;

    JsErrorCode inflateStatus = TTDHandleBreakpointInfoAndInflate(startSnapTime, runtime, threadContext);
    if(inflateStatus != JsNoError)
    {
        return inflateStatus;
    }

    //If we are in the "active" segment set the continue breakpoint
    if((moveMode & JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) == JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment)
    {
        GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            emanager->SetBPInfoForActiveSegmentContinueScan(threadContext->TTDContext);

            return JsNoError;
        });
    }

    elog->PushMode(TTD::TTDMode::DebuggerSuppressBreakpoints);
    elog->PushMode(TTD::TTDMode::DebuggerLogBreakpoints);
    try
    {
        if(endSnapTime == -1)
        {
            elog->ReplayRootEventsToTime(TTD_EVENT_MAXTIME);
        }
        else
        {
            elog->ReplayRootEventsToTime(endSnapTime);
        }
    }
    catch(TTD::TTDebuggerAbortException abortException)
    {
        //If we hit the end of the log or we hit a terminal exception that is fine -- anything else is a problem
        if(!abortException.IsEndOfLog() && !abortException.IsTopLevelException())
        {
            res = JsErrorFatal;
        }
    }
    catch(...) //we are replaying something that should be known to execute successfully so encountering any error is very bad
    {
        res = JsErrorFatal;
        TTDAssert(false, "Unexpected fatal Error");
    }
    elog->PopMode(TTD::TTDMode::DebuggerLogBreakpoints);
    elog->PopMode(TTD::TTDMode::DebuggerSuppressBreakpoints);

    //If we are in the "active" segment un-set the continue breakpoint
    if((moveMode & JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment) == JsTTDMoveMode::JsTTDMoveScanIntervalForContinueInActiveBreakpointSegment)
    {
        GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            emanager->ClearBPInfoForActiveSegmentContinueScan(threadContext->TTDContext);

            return JsNoError;
        });
    }

    if((moveMode & JsTTDMoveMode::JsTTDMoveScanIntervalForContinue) == JsTTDMoveMode::JsTTDMoveScanIntervalForContinue)
    {
        bool bpFound = emanager->TryFindAndSetPreviousBP();
        if(bpFound)
        {
            *newTargetEventTime = emanager->GetPendingTTDBPTargetEventTime();
        }
    }

    return res;
#endif
}